

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O2

void fdb_gather_stale_blocks
               (fdb_kvs_handle *handle,filemgr_header_revnum_t revnum,bid_t prev_hdr,
               uint64_t kv_info_offset,fdb_seqnum_t seqnum,list_elem *e_last,bool from_mergetree)

{
  char *__s;
  uint uVar1;
  btreeblk_handle *pbVar2;
  filemgr *pfVar3;
  avl_node *paVar4;
  list_elem *plVar5;
  docio_handle *handle_00;
  btree *btree;
  filemgr_header_revnum_t revnum_00;
  ulong *__ptr;
  ulong uVar6;
  avl_node *node;
  list *plVar7;
  list_elem *e;
  size_t sVar8;
  bid_t doc_offset;
  byte bVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  ulong *__size;
  fdb_kvs_handle *pfVar14;
  bool bVar15;
  undefined8 auStack_120 [4];
  ulong uStack_100;
  undefined1 auStack_f8 [8];
  undefined1 local_f0 [8];
  kvs_stat stat;
  ulong local_78;
  filemgr_header_revnum_t _revnum;
  list *local_68;
  ulong local_60;
  bid_t _doc_offset;
  fdb_kvs_handle *local_50;
  uint local_44;
  ulong *local_40;
  bool local_32;
  byte local_31;
  
  if (handle->file->stale_list == (list *)0x0) {
    btreeblk_reset_subblock_info(handle->bhandle);
    return;
  }
  local_31 = from_mergetree;
  _doc_offset = (bid_t)e_last;
  _kvs_stat_get(handle->file,0,(kvs_stat *)local_f0);
  pbVar2 = handle->bhandle;
  pbVar2->nlivenodes = (int64_t)local_f0;
  pbVar2->ndeltanodes = (int64_t)local_f0;
  local_50 = handle;
  __ptr = (ulong *)calloc(1,0x2000);
  local_78 = revnum >> 0x38 | (revnum & 0xff000000000000) >> 0x28 |
             (revnum & 0xff0000000000) >> 0x18 | (revnum & 0xff00000000) >> 8 |
             (revnum & 0xff000000) << 8 | (revnum & 0xff0000) << 0x18 | (revnum & 0xff00) << 0x28 |
             revnum << 0x38;
  *__ptr = 0xffffffffffffffff;
  uVar6 = 0xffffffffffffffff;
  if (1 < prev_hdr + 1) {
    uVar6 = prev_hdr >> 0x38 | (prev_hdr & 0xff000000000000) >> 0x28 |
            (prev_hdr & 0xff0000000000) >> 0x18 | (prev_hdr & 0xff00000000) >> 8 |
            (prev_hdr & 0xff000000) << 8 | (prev_hdr & 0xff0000) << 0x18 |
            (prev_hdr & 0xff00) << 0x28 | prev_hdr << 0x38;
  }
  __ptr[1] = uVar6;
  __ptr[2] = kv_info_offset >> 0x38 | (kv_info_offset & 0xff000000000000) >> 0x28 |
             (kv_info_offset & 0xff0000000000) >> 0x18 | (kv_info_offset & 0xff00000000) >> 8 |
             (kv_info_offset & 0xff000000) << 8 | (kv_info_offset & 0xff0000) << 0x18 |
             (kv_info_offset & 0xff00) << 0x28 | kv_info_offset << 0x38;
  __ptr[3] = seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 |
             (seqnum & 0xff0000000000) >> 0x18 | (seqnum & 0xff00000000) >> 8 |
             (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 | (seqnum & 0xff00) << 0x28 |
             seqnum << 0x38;
  local_68 = (list *)(_doc_offset + 8);
  bVar15 = true;
  bVar9 = 1;
  uVar13 = 0;
  pcVar12 = auStack_f8;
  __size = (ulong *)0x2000;
  _revnum = revnum;
  while (pfVar14 = local_50, bVar15) {
    local_32 = (bool)(bVar9 & local_31);
    if (local_32 == true) {
      pfVar3 = local_50->file;
      pcVar12[-8] = -0x47;
      pcVar12[-7] = '\b';
      pcVar12[-6] = '\x14';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      local_40 = __ptr;
      node = avl_first(&pfVar3->mergetree);
      pcVar12[-8] = '$';
      pcVar12[-7] = '\0';
      pcVar12[-6] = '\0';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      uVar6 = *(ulong *)(pcVar12 + -8) & 0xffffffff;
      for (; iVar11 = (int)uVar6, __ptr = local_40, uVar1 = uVar13, node != (avl_node *)0x0;
          node = avl_next(node)) {
        if (pfVar14->staletree != (btree *)0x0) {
          uVar13 = uVar13 + 1;
          paVar4 = node[-1].left;
          uVar1 = *(uint *)&node[-1].right;
          *(ulong *)((long)local_40 + uVar6) =
               (ulong)paVar4 >> 0x38 | ((ulong)paVar4 & 0xff000000000000) >> 0x28 |
               ((ulong)paVar4 & 0xff0000000000) >> 0x18 | ((ulong)paVar4 & 0xff00000000) >> 8 |
               ((ulong)paVar4 & 0xff000000) << 8 | ((ulong)paVar4 & 0xff0000) << 0x18 |
               ((ulong)paVar4 & 0xff00) << 0x28 | (long)paVar4 << 0x38;
          *(uint *)((long)local_40 + (ulong)(iVar11 + 8)) =
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          uVar6 = (ulong)(iVar11 + 0xc);
          if (((ulong)__size & 0xffffffff) <= uVar6 + 0xc) {
            __size = (ulong *)(ulong)(uint)((int)__size * 2);
            builtin_strncpy(pcVar12 + -8,"\v\t\x14",4);
            pcVar12[-4] = '\0';
            pcVar12[-3] = '\0';
            pcVar12[-2] = '\0';
            pcVar12[-1] = '\0';
            local_40 = (ulong *)realloc(local_40,(size_t)__size);
          }
        }
        builtin_strncpy(pcVar12 + -8,"\x17\t\x14",4);
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
      }
    }
    else {
      plVar7 = local_68;
      if (_doc_offset == 0) {
        plVar7 = local_50->file->stale_list;
      }
      e = plVar7->head;
      pcVar12[-8] = '$';
      pcVar12[-7] = '\0';
      pcVar12[-6] = '\0';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      uVar6 = *(ulong *)(pcVar12 + -8) & 0xffffffff;
      local_44 = uVar13;
      local_40 = __size;
      while (iVar11 = (int)uVar6, __size = local_40, uVar1 = local_44, e != (list_elem *)0x0) {
        if (pfVar14->staletree != (btree *)0x0) {
          local_44 = local_44 + 1;
          plVar5 = e[-1].prev;
          uVar13 = *(uint *)&e[-1].next;
          *(ulong *)((long)__ptr + uVar6) =
               (ulong)plVar5 >> 0x38 | ((ulong)plVar5 & 0xff000000000000) >> 0x28 |
               ((ulong)plVar5 & 0xff0000000000) >> 0x18 | ((ulong)plVar5 & 0xff00000000) >> 8 |
               ((ulong)plVar5 & 0xff000000) << 8 | ((ulong)plVar5 & 0xff0000) << 0x18 |
               ((ulong)plVar5 & 0xff00) << 0x28 | (long)plVar5 << 0x38;
          *(uint *)((long)__ptr + (ulong)(iVar11 + 8)) =
               uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
          uVar6 = (ulong)(iVar11 + 0xc);
          if (((ulong)local_40 & 0xffffffff) <= uVar6 + 0xc) {
            local_40 = (ulong *)(ulong)(uint)((int)local_40 * 2);
            pcVar12[-8] = -0x70;
            pcVar12[-7] = '\t';
            pcVar12[-6] = '\x14';
            pcVar12[-5] = '\0';
            pcVar12[-4] = '\0';
            pcVar12[-3] = '\0';
            pcVar12[-2] = '\0';
            pcVar12[-1] = '\0';
            __ptr = (ulong *)realloc(__ptr,(size_t)local_40);
          }
        }
        pfVar14 = local_50;
        plVar5 = e + -1;
        plVar7 = local_50->file->stale_list;
        pcVar12[-8] = -0x52;
        pcVar12[-7] = '\t';
        pcVar12[-6] = '\x14';
        pcVar12[-5] = '\0';
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
        e = list_remove(plVar7,e);
        pcVar12[-8] = -0x47;
        pcVar12[-7] = '\t';
        pcVar12[-6] = '\x14';
        pcVar12[-5] = '\0';
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
        free(plVar5);
      }
    }
    revnum_00 = _revnum;
    bVar15 = false;
    bVar9 = 0;
    uVar13 = 0;
    if (uVar1 != 0) {
      __s = pcVar12 + -0x20;
      *(uint *)(__ptr + 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      stat.deltasize = 0;
      builtin_strncpy(pcVar12 + -0x28,"1\n\x14",4);
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      local_40 = __size;
      sprintf(__s,"stale_blocks_%lu",_revnum);
      builtin_strncpy(pcVar12 + -0x28,"D\n\x14",4);
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      sVar8 = strlen(__s);
      pfVar14 = local_50;
      stat.deltasize = CONCAT44(iVar11,CONCAT22(0,(short)sVar8 + 1));
      handle_00 = local_50->dhandle;
      builtin_strncpy(pcVar12 + -0x28,"w\n\x14",4);
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      doc_offset = docio_append_doc_system(handle_00,(docio_object *)&stat.deltasize);
      local_60 = doc_offset >> 0x38 | (doc_offset & 0xff000000000000) >> 0x28 |
                 (doc_offset & 0xff0000000000) >> 0x18 | (doc_offset & 0xff00000000) >> 8 |
                 (doc_offset & 0xff000000) << 8 | (doc_offset & 0xff0000) << 0x18 |
                 (doc_offset & 0xff00) << 0x28 | doc_offset << 0x38;
      btree = pfVar14->staletree;
      pcVar12[-0x28] = -0x6e;
      pcVar12[-0x27] = '\n';
      pcVar12[-0x26] = '\x14';
      pcVar12[-0x25] = '\0';
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      btree_insert(btree,&local_78,&local_60);
      pbVar2 = pfVar14->bhandle;
      pcVar12[-0x28] = -0x65;
      pcVar12[-0x27] = '\n';
      pcVar12[-0x26] = '\x14';
      pcVar12[-0x25] = '\0';
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      btreeblk_end(pbVar2);
      pbVar2 = pfVar14->bhandle;
      pcVar12[-0x28] = -0x5c;
      pcVar12[-0x27] = '\n';
      pcVar12[-0x26] = '\x14';
      pcVar12[-0x25] = '\0';
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      btreeblk_reset_subblock_info(pbVar2);
      pcVar12[-0x28] = -0x42;
      pcVar12[-0x27] = '\n';
      pcVar12[-0x26] = '\x14';
      pcVar12[-0x25] = '\0';
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      fdb_add_inmem_stale_info
                (pfVar14,revnum_00,(docio_object *)&stat.deltasize,doc_offset,local_32);
      bVar15 = pfVar14->file->stale_list->head != (list_elem *)0x0;
      uVar13 = uVar1;
      if (bVar15) {
        *__ptr = local_60;
        uVar13 = 0;
      }
      bVar9 = 0;
      pcVar12 = __s;
      __size = local_40;
    }
  }
  pfVar3 = local_50->file;
  lVar10 = local_50->bhandle->nlivenodes - (long)local_f0;
  builtin_strncpy(pcVar12 + -8,"\x11\v\x14",4);
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  _kvs_stat_update_attr(pfVar3,0,KVS_STAT_NLIVENODES,lVar10);
  pfVar3 = pfVar14->file;
  lVar10 = pfVar14->bhandle->ndeltanodes;
  uVar13 = (pfVar14->config).blocksize;
  pcVar12[-8] = '\x06';
  pcVar12[-7] = '\0';
  pcVar12[-6] = '\0';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  builtin_strncpy(pcVar12 + -8,"5\v\x14",4);
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  _kvs_stat_update_attr
            (pfVar3,0,(kvs_stat_attr_t)*(undefined8 *)(pcVar12 + -8),
             (ulong)uVar13 * (lVar10 - (long)local_f0));
  builtin_strncpy(pcVar12 + -8,"=\v\x14",4);
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  free(__ptr);
  return;
}

Assistant:

void fdb_gather_stale_blocks(fdb_kvs_handle *handle,
                             filemgr_header_revnum_t revnum,
                             bid_t prev_hdr,
                             uint64_t kv_info_offset,
                             fdb_seqnum_t seqnum,
                             struct list_elem *e_last,
                             bool from_mergetree)
{
    int64_t delta;
    int r;
    uint32_t count = 0;
    uint32_t offset = 0, count_location;
    uint32_t bufsize = 8192;
    uint32_t _count, _len;
    uint64_t _pos, _kv_info_offset;
    uint8_t *buf = NULL;
    bid_t doc_offset, _doc_offset;
    bid_t _prev_hdr;
    bool gather_staleblocks = true;
    bool first_loop = true;
    filemgr_header_revnum_t _revnum;
    fdb_seqnum_t _seqnum;
    struct kvs_stat stat;

    /*
     * << stale block system doc structure >>
     * [previous doc offset]: 8 bytes (0xffff.. if not exist)
     * [previous header BID]: 8 bytes (0xffff.. if not exist)
     * [KVS info doc offset]: 8 bytes (0xffff.. if not exist)
     * [Default KVS seqnum]:  8 bytes
     * [# items]:             4 bytes
     * ---
     * [position]:            8 bytes
     * [length]:              4 bytes
     * ...
     */

    if (filemgr_get_stale_list(handle->file)) {
        struct avl_node *a;
        struct list_elem *e;
        struct stale_data *item;

        r = _kvs_stat_get(handle->file, 0, &stat);
        handle->bhandle->nlivenodes = stat.nlivenodes;
        handle->bhandle->ndeltanodes = stat.nlivenodes;
        (void)r;

        buf = (uint8_t *)calloc(1, bufsize);
        _revnum = _endian_encode(revnum);

        // initial previous doc offset
        memset(buf, 0xff, sizeof(bid_t));
        count_location = sizeof(bid_t);

        // previous header BID
        if (prev_hdr == 0 || prev_hdr == BLK_NOT_FOUND) {
            // does not exist
            memset(&_prev_hdr, 0xff, sizeof(_prev_hdr));
        } else {
            _prev_hdr = _endian_encode(prev_hdr);
        }
        memcpy(buf + sizeof(bid_t), &_prev_hdr, sizeof(bid_t));
        count_location += sizeof(bid_t);

        // KVS info doc offset
        _kv_info_offset = _endian_encode(kv_info_offset);
        memcpy(buf + count_location, &_kv_info_offset, sizeof(uint64_t));
        count_location += sizeof(uint64_t);

        // default KVS seqnum
        _seqnum = _endian_encode(seqnum);
        memcpy(buf + count_location, &_seqnum, sizeof(fdb_seqnum_t));
        count_location += sizeof(fdb_seqnum_t);
        count_location += sizeof(count);

        while(gather_staleblocks) {
            // reserve space for
            // prev offset (8), prev header (8), kv_info_offset (8),
            // seqnum (8), count (4)
            offset = count_location;

            if (first_loop && from_mergetree) {
                // gather from mergetree
                a = avl_first(&handle->file->mergetree);
                while (a) {
                    item = _get_entry(a, struct stale_data, avl);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }


                    // If 'from_mergetree' flag is set, it means that this
                    // function is called at the end of fdb_get_reusable_block(),
                    // and those items are remaining (non-reusable) regions after
                    // picking up reusable blocks from 'mergetree'.

                    // In the previous implementation, those items are converted
                    // and stored as a system document. The document is re-read in
                    // the next block reclaim, and then we reconstruct 'mergetree'
                    // from the document; this is unnecessary duplicated overhead.

                    // As an optimization, we can simply keep those items in
                    // 'mergetree' and use them in the next block reclaim, without
                    // reading the corresponding system document; this also reduces
                    // the commit latency much. Instead, to minimize memory
                    // consumption, we don't need to maintain in-memory copy of the
                    // system doc corresponding to the remaining items in the
                    // 'mergetree', that will be created below.

                    // do not remove the item
                    a = avl_next(&item->avl);
                }
            } else {
                // gater from stale_list
                if (e_last) {
                    e = list_next(e_last);
                } else {
                    e = list_begin(handle->file->stale_list);
                }
                while (e) {
                    item = _get_entry(e, struct stale_data, le);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }

                    e = list_remove(handle->file->stale_list, e);
                    free(item);
                }
            }

            gather_staleblocks = false;
            if (count) {
                char *doc_key = alca(char, 32);
                struct docio_object doc;

                // store count
                _count = _endian_encode(count);
                memcpy(buf + count_location - sizeof(_count), &_count, sizeof(_count));

                // append a system doc
                memset(&doc, 0x0, sizeof(doc));
                // add one to 'revnum' to get the next revision number
                // (note that filemgr_mutex() is grabbed so that no other thread
                //  will change the 'revnum').
                sprintf(doc_key, "stale_blocks_%" _F64, revnum);
                doc.key = (void*)doc_key;
                doc.body = buf;
                doc.length.keylen = strlen(doc_key) + 1;
                doc.length.metalen = 0;
                doc.length.bodylen = offset;
                doc.seqnum = 0;
                doc_offset = docio_append_doc_system(handle->dhandle, &doc);

                // insert into stale-block tree
                _doc_offset = _endian_encode(doc_offset);
                btree_insert(handle->staletree, (void *)&_revnum, (void *)&_doc_offset);
                btreeblk_end(handle->bhandle);
                btreeblk_reset_subblock_info(handle->bhandle);

                if (from_mergetree && first_loop) {
                    // if from_mergetree flag is set and this is the first loop,
                    // stale regions in this document are already in mergetree
                    // so skip adding them into in-memory stale info tree.

                    // however, the system doc itself should be marked as stale
                    // when the doc is reclaimed, thus we instead add a dummy entry
                    // that containing doc offset, length info only.
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, true);
                } else {
                    // add the doc into in-memory stale info tree
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, false);
                }

                if (list_begin(filemgr_get_stale_list(handle->file))) {
                    // updating stale tree brings another stale blocks.
                    // recursively update until there is no more stale block.

                    // note that infinite loop will not occur because
                    // 1) all updated index blocks for stale tree are still writable
                    // 2) incoming keys for stale tree (revnum) are monotonic
                    //    increasing order; most recently allocated node will be
                    //    updated again.

                    count = 0;
                    // save previous doc offset
                    memcpy(buf, &_doc_offset, sizeof(_doc_offset));

                    // gather once again
                    gather_staleblocks = true;
                }
            }

            first_loop = false;
        } // gather stale blocks

        delta = handle->bhandle->nlivenodes - stat.nlivenodes;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_NLIVENODES, delta);
        delta = handle->bhandle->ndeltanodes - stat.nlivenodes;
        delta *= handle->config.blocksize;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_DELTASIZE, delta);

        free(buf);
    } else {
        btreeblk_reset_subblock_info(handle->bhandle);
    }
}